

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O3

void square_know_pile(chunk_conflict *c,loc grid,_func__Bool_object_ptr *pred)

{
  _Bool _Var1;
  object *obj;
  
  if (cave != c) {
    return;
  }
  object_lists_check_integrity(c,(chunk_conflict *)player->cave);
  for (obj = square_object(c,grid); obj != (object *)0x0; obj = obj->next) {
    if ((pred == (_func__Bool_object_ptr *)0x0) || (_Var1 = (*pred)(obj), _Var1)) {
      object_see(player,obj);
      _Var1 = loc_eq((loc_conflict)grid,player->grid);
      if (_Var1) {
        object_touch(player,obj);
      }
    }
  }
  forget_remembered_objects(c,(chunk_conflict *)player->cave,grid,pred);
  return;
}

Assistant:

void square_know_pile(struct chunk *c, struct loc grid,
		bool (*pred)(const struct object*))
{
	struct object *obj;

	if (c != cave) return;

	object_lists_check_integrity(c, player->cave);

	/*
	 * Know every item of the requested classes on this grid with greater
	 * knowledge for the player grid.
	 */
	for (obj = square_object(c, grid); obj; obj = obj->next) {
		if (!pred || (*pred)(obj)) {
			object_see(player, obj);
			if (loc_eq(grid, player->grid)) {
				object_touch(player, obj);
			}
		}
	}

	forget_remembered_objects(c, player->cave, grid, pred);
}